

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

void __thiscall yactfr::internal::PseudoErt::_validateNotEmpty(PseudoErt *this,PseudoDst *pseudoDst)

{
  TextLocation loc;
  bool bVar1;
  uint uVar2;
  pointer pPVar3;
  PseudoDt *pPVar4;
  TextLocation local_1d8;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream ss;
  PseudoDst *pseudoDst_local;
  PseudoErt *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->_pseudoPayloadType);
  if (bVar1) {
    pPVar3 = std::
             unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
             ::operator->(&this->_pseudoPayloadType);
    uVar2 = (*pPVar3->_vptr_PseudoDt[3])();
    if ((uVar2 & 1) == 0) {
      return;
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->_pseudoSpecCtxType);
  if (bVar1) {
    pPVar3 = std::
             unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
             ::operator->(&this->_pseudoSpecCtxType);
    uVar2 = (*pPVar3->_vptr_PseudoDt[3])();
    if ((uVar2 & 1) == 0) {
      return;
    }
  }
  pPVar4 = PseudoDst::pseudoErCommonCtxType(pseudoDst);
  if (pPVar4 != (PseudoDt *)0x0) {
    pPVar4 = PseudoDst::pseudoErCommonCtxType(pseudoDst);
    uVar2 = (*pPVar4->_vptr_PseudoDt[3])();
    if ((uVar2 & 1) == 0) {
      return;
    }
  }
  pPVar4 = PseudoDst::pseudoErHeaderType(pseudoDst);
  if (pPVar4 != (PseudoDt *)0x0) {
    pPVar4 = PseudoDst::pseudoErHeaderType(pseudoDst);
    uVar2 = (*pPVar4->_vptr_PseudoDt[3])();
    if ((uVar2 & 1) == 0) {
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"Any event record would be empty (no data).");
  std::__cxx11::ostringstream::str();
  local_1d8._offset = 0;
  local_1d8._lineNumber = 0;
  local_1d8._colNumber = 0;
  TextLocation::TextLocation(&local_1d8);
  loc._lineNumber = local_1d8._lineNumber;
  loc._offset = local_1d8._offset;
  loc._colNumber = local_1d8._colNumber;
  throwTextParseError(&local_1c0,loc);
}

Assistant:

void PseudoErt::_validateNotEmpty(const PseudoDst& pseudoDst) const
{
    /*
     * Make sure that we can't guarantee that an instance of this event
     * record type is empty.
     */
    if (_pseudoPayloadType && !_pseudoPayloadType->isEmpty()) {
        return;
    }

    if (_pseudoSpecCtxType && !_pseudoSpecCtxType->isEmpty()) {
        return;
    }

    if (pseudoDst.pseudoErCommonCtxType() && !pseudoDst.pseudoErCommonCtxType()->isEmpty()) {
        return;
    }

    if (pseudoDst.pseudoErHeaderType() && !pseudoDst.pseudoErHeaderType()->isEmpty()) {
        return;
    }

    std::ostringstream ss;

    ss << "Any event record would be empty (no data).";
    throwTextParseError(ss.str());
}